

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudio_CreateSourceVoice
                   (FAudio *audio,FAudioSourceVoice **ppSourceVoice,
                   FAudioWaveFormatEx *pSourceFormat,uint32_t Flags,float MaxFrequencyRatio,
                   FAudioVoiceCallback *pCallback,FAudioVoiceSends *pSendList,
                   FAudioEffectChain *pEffectChain)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  void *pvVar4;
  FAudioMutex pvVar5;
  undefined2 *puVar6;
  FAudioVoiceSends *pFVar7;
  ulong uVar8;
  FAudioVoice *pFVar9;
  FAudio *pFVar10;
  uint in_ECX;
  code *pcVar11;
  FAudioVoice *in_RDX;
  long *in_RSI;
  FAudio *in_RDI;
  undefined8 in_R8;
  float in_XMM0_Da;
  double dVar12;
  FAudioEffectChain *unaff_retaddr;
  FAudioVoice *in_stack_00000008;
  SDL_AssertState sdl_assert_state_5;
  SDL_AssertState sdl_assert_state_4;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  FAudioWaveFormatExtensible *fmtex_3;
  size_t cbSize_1;
  FAudioXMA2WaveFormat *fmtex_2;
  size_t cbSize;
  FAudioADPCMWaveFormat *fmtex_1;
  FAudioWaveFormatExtensible *fmtex;
  SDL_AssertState sdl_assert_state;
  uint32_t i;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  FAudio *in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  FAudioVoice *in_stack_ffffffffffffff60;
  FAudioVoice *in_stack_ffffffffffffff68;
  FAudioVoiceSends *in_stack_ffffffffffffff70;
  FAudioVoice *in_stack_ffffffffffffff78;
  uint local_34;
  
  pvVar4 = (*in_RDI->pMalloc)(0x148);
  *in_RSI = (long)pvVar4;
  SDL_memset(*in_RSI,0,0x148);
  *(FAudio **)*in_RSI = in_RDI;
  *(undefined4 *)(*in_RSI + 0xc) = 0;
  *(uint *)(*in_RSI + 8) = in_ECX;
  *(undefined4 *)(*in_RSI + 0x78) = 0;
  *(undefined4 *)(*in_RSI + 0x7c) = 0x3f800000;
  *(undefined4 *)(*in_RSI + 0x80) = 0x3f800000;
  pvVar5 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RSI + 0x90) = pvVar5;
  pvVar5 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RSI + 0x98) = pvVar5;
  pvVar5 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RSI + 0xa0) = pvVar5;
  pvVar5 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RSI + 0xc0) = pvVar5;
  do {
    if (in_XMM0_Da <= 1024.0) goto LAB_001249e7;
    iVar2 = SDL_ReportAssertion(&FAudio_CreateSourceVoice::sdl_assert_data,
                                "FAudio_CreateSourceVoice",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0x123);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar11 = (code *)swi(3);
    uVar3 = (*pcVar11)();
    return uVar3;
  }
LAB_001249e7:
  *(float *)(*in_RSI + 0xf4) = in_XMM0_Da;
  if (((*(short *)&in_RDX->audio == 1) || (*(short *)&in_RDX->audio == 3)) ||
     (*(short *)&in_RDX->audio == 0x161)) {
    puVar6 = (undefined2 *)(*in_RDI->pMalloc)(0x28);
    *puVar6 = 0xfffe;
    puVar6[1] = *(undefined2 *)((long)&in_RDX->audio + 2);
    *(undefined4 *)(puVar6 + 2) = *(undefined4 *)((long)&in_RDX->audio + 4);
    *(uint32_t *)(puVar6 + 4) = in_RDX->flags;
    puVar6[6] = (short)in_RDX->type;
    puVar6[7] = *(undefined2 *)((long)&in_RDX->type + 2);
    puVar6[8] = 0x16;
    puVar6[9] = *(undefined2 *)((long)&in_RDX->type + 2);
    *(undefined4 *)(puVar6 + 10) = 0;
    if (*(short *)&in_RDX->audio == 1) {
      SDL_memcpy(puVar6 + 0xc,&DATAFORMAT_SUBTYPE_PCM,0x10);
    }
    else if (*(short *)&in_RDX->audio == 3) {
      SDL_memcpy(puVar6 + 0xc,&DATAFORMAT_SUBTYPE_IEEE_FLOAT,0x10);
    }
    else if (*(short *)&in_RDX->audio == 0x161) {
      SDL_memcpy(puVar6 + 0xc,&DATAFORMAT_SUBTYPE_WMAUDIO2,0x10);
    }
    *(undefined2 **)(*in_RSI + 0xf8) = puVar6;
  }
  else if (*(short *)&in_RDX->audio == 2) {
    pFVar7 = (FAudioVoiceSends *)(*in_RDI->pMalloc)(0x16);
    uVar8 = (ulong)(ushort)(in_RDX->sends).SendCount;
    pFVar9 = (FAudioVoice *)(uVar8 + 0x12);
    in_stack_ffffffffffffff68 = pFVar9;
    if ((FAudioVoice *)0x15 < pFVar9) {
      in_stack_ffffffffffffff68 = (FAudioVoice *)0x16;
    }
    in_stack_ffffffffffffff70 = pFVar7;
    SDL_memcpy(pFVar7,in_RDX,in_stack_ffffffffffffff68);
    if (pFVar9 < (FAudioVoice *)0x16) {
      SDL_memset((long)&pFVar7[1].pSends + uVar8 + 2,0,0x16 - (long)pFVar9);
    }
    *(undefined2 *)&pFVar7[1].pSends = 4;
    *(short *)((long)&pFVar7[1].pSends + 2) =
         ((short)((ulong)(ushort)pFVar7[1].SendCount /
                 (ulong)(long)(int)(uint)*(ushort *)((long)&pFVar7->SendCount + 2)) + -6) * 2;
    *(FAudioVoiceSends **)(*in_RSI + 0xf8) = pFVar7;
    in_stack_ffffffffffffff78 = in_RDX;
  }
  else if (*(short *)&in_RDX->audio == 0x166) {
    pvVar4 = (*in_RDI->pMalloc)(0x34);
    pFVar10 = (FAudio *)((ulong)(ushort)(in_RDX->sends).SendCount + 0x12);
    in_stack_ffffffffffffff50 = pFVar10;
    if ((FAudio *)0x33 < pFVar10) {
      in_stack_ffffffffffffff50 = (FAudio *)0x34;
    }
    in_stack_ffffffffffffff58 = pvVar4;
    SDL_memcpy(pvVar4,in_RDX,in_stack_ffffffffffffff50);
    if (pFVar10 < (FAudio *)0x34) {
      SDL_memset((long)pvVar4 + (long)pFVar10,0,0x16 - (long)pFVar10);
    }
    *(undefined2 *)((long)pvVar4 + 0x10) = 0x22;
    *(void **)(*in_RSI + 0xf8) = pvVar4;
    in_stack_ffffffffffffff60 = in_RDX;
  }
  else {
    pvVar4 = (*in_RDI->pMalloc)((ulong)(ushort)(in_RDX->sends).SendCount + 0x12);
    *(void **)(*in_RSI + 0xf8) = pvVar4;
    SDL_memcpy(*(undefined8 *)(*in_RSI + 0xf8),in_RDX,
               (ulong)(ushort)(in_RDX->sends).SendCount + 0x12);
  }
  *(undefined8 *)(*in_RSI + 0x110) = in_R8;
  *(undefined1 *)(*in_RSI + 0x118) = 0;
  *(undefined4 *)(*in_RSI + 0x11c) = 0x3f800000;
  *(undefined8 *)(*in_RSI + 0x128) = 0;
  *(undefined8 *)(*in_RSI + 0x130) = 0;
  *(undefined8 *)(*in_RSI + 0x138) = 0;
  pvVar5 = FAudio_PlatformCreateMutex();
  *(FAudioMutex *)(*in_RSI + 0x140) = pvVar5;
  if (**(short **)(*in_RSI + 0xf8) == -2) {
    lVar1 = *(long *)(*in_RSI + 0xf8);
    iVar2 = SDL_memcmp(lVar1 + 0x18,&DATAFORMAT_SUBTYPE_PCM,0x10);
    if (iVar2 == 0) {
      if (*(short *)(lVar1 + 0xe) == 0x10) {
        *(code **)(*in_RSI + 0x100) = FAudio_INTERNAL_DecodePCM16;
      }
      else if (*(short *)(lVar1 + 0xe) == 8) {
        *(code **)(*in_RSI + 0x100) = FAudio_INTERNAL_DecodePCM8;
      }
      else if (*(short *)(lVar1 + 0xe) == 0x18) {
        *(code **)(*in_RSI + 0x100) = FAudio_INTERNAL_DecodePCM24;
      }
      else if (*(short *)(lVar1 + 0xe) == 0x20) {
        *(code **)(*in_RSI + 0x100) = FAudio_INTERNAL_DecodePCM32;
      }
      else {
        do {
          iVar2 = SDL_ReportAssertion(&FAudio_CreateSourceVoice::sdl_assert_data_1,
                                      "FAudio_CreateSourceVoice",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                      ,0x1ac);
        } while (iVar2 == 0);
        if (iVar2 == 1) {
          pcVar11 = (code *)swi(3);
          uVar3 = (*pcVar11)();
          return uVar3;
        }
      }
    }
    else {
      iVar2 = SDL_memcmp(lVar1 + 0x18,&DATAFORMAT_SUBTYPE_IEEE_FLOAT,0x10);
      if (iVar2 == 0) {
        if (*(short *)(lVar1 + 0xe) == 0x10) {
          *(code **)(*in_RSI + 0x100) = FAudio_INTERNAL_DecodePCM16;
        }
        else {
          *(code **)(*in_RSI + 0x100) = FAudio_INTERNAL_DecodePCM32F;
        }
      }
      else {
        iVar2 = SDL_memcmp(lVar1 + 0x18,&DATAFORMAT_SUBTYPE_WMAUDIO2,0x10);
        if (((iVar2 == 0) ||
            (iVar2 = SDL_memcmp(lVar1 + 0x18,&DATAFORMAT_SUBTYPE_WMAUDIO3,0x10), iVar2 == 0)) ||
           (iVar2 = SDL_memcmp(lVar1 + 0x18,&DATAFORMAT_SUBTYPE_WMAUDIO_LOSSLESS,0x10), iVar2 == 0))
        {
          do {
            iVar2 = SDL_ReportAssertion(&FAudio_CreateSourceVoice::sdl_assert_data_2,
                                        "FAudio_CreateSourceVoice",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                        ,0x1cc);
          } while (iVar2 == 0);
          if (iVar2 == 1) {
            pcVar11 = (code *)swi(3);
            uVar3 = (*pcVar11)();
            return uVar3;
          }
          *(code **)(*in_RSI + 0x100) = FAudio_INTERNAL_DecodeWMAERROR;
        }
        else {
          do {
            iVar2 = SDL_ReportAssertion(&FAudio_CreateSourceVoice::sdl_assert_data_3,
                                        "FAudio_CreateSourceVoice",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                        ,0x1d2);
          } while (iVar2 == 0);
          if (iVar2 == 1) {
            pcVar11 = (code *)swi(3);
            uVar3 = (*pcVar11)();
            return uVar3;
          }
        }
      }
    }
  }
  else if (**(short **)(*in_RSI + 0xf8) == 0x166) {
    do {
      iVar2 = SDL_ReportAssertion(&FAudio_CreateSourceVoice::sdl_assert_data_4,
                                  "FAudio_CreateSourceVoice",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                  ,0x1de);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar11 = (code *)swi(3);
      uVar3 = (*pcVar11)();
      return uVar3;
    }
    *(code **)(*in_RSI + 0x100) = FAudio_INTERNAL_DecodeWMAERROR;
  }
  else if (**(short **)(*in_RSI + 0xf8) == 2) {
    pcVar11 = FAudio_INTERNAL_DecodeMonoMSADPCM;
    if (*(short *)(*(long *)(*in_RSI + 0xf8) + 2) == 2) {
      pcVar11 = FAudio_INTERNAL_DecodeStereoMSADPCM;
    }
    *(code **)(*in_RSI + 0x100) = pcVar11;
  }
  else {
    do {
      iVar2 = SDL_ReportAssertion(&FAudio_CreateSourceVoice::sdl_assert_data_5,
                                  "FAudio_CreateSourceVoice",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                  ,0x1ea);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar11 = (code *)swi(3);
      uVar3 = (*pcVar11)();
      return uVar3;
    }
  }
  if (*(short *)(*(long *)(*in_RSI + 0xf8) + 2) == 1) {
    *(FAudioResampleCallback *)(*in_RSI + 0x108) = FAudio_INTERNAL_ResampleMono;
  }
  else if (*(short *)(*(long *)(*in_RSI + 0xf8) + 2) == 2) {
    *(FAudioResampleCallback *)(*in_RSI + 0x108) = FAudio_INTERNAL_ResampleStereo;
  }
  else {
    *(code **)(*in_RSI + 0x108) = FAudio_INTERNAL_ResampleGeneric;
  }
  *(undefined4 *)(*in_RSI + 0xf0) = 0;
  FAudio_INTERNAL_VoiceOutputFrequency
            (in_stack_ffffffffffffff68,(FAudioVoiceSends *)in_stack_ffffffffffffff60);
  FAudioVoice_SetEffectChain(in_stack_00000008,unaff_retaddr);
  *(undefined4 *)(*in_RSI + 0xa8) = 0x3f800000;
  pvVar4 = (*in_RDI->pMalloc)((ulong)*(uint *)(*in_RSI + 0xb8) << 2);
  *(void **)(*in_RSI + 0xb0) = pvVar4;
  for (local_34 = 0; local_34 < *(uint *)(*in_RSI + 0xb8); local_34 = local_34 + 1) {
    *(undefined4 *)(*(long *)(*in_RSI + 0xb0) + (ulong)local_34 * 4) = 0x3f800000;
  }
  FAudioVoice_SetOutputVoices(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if ((in_ECX & 8) != 0) {
    pvVar4 = (*in_RDI->pMalloc)((ulong)*(ushort *)(*(long *)(*in_RSI + 0xf8) + 2) << 4);
    *(void **)(*in_RSI + 0x88) = pvVar4;
    SDL_memset(*(undefined8 *)(*in_RSI + 0x88),0,
               (ulong)*(ushort *)(*(long *)(*in_RSI + 0xf8) + 2) << 4);
  }
  dVar12 = (double)SDL_ceil(((double)in_RDI->updateSize * (double)in_XMM0_Da *
                            (double)*(uint *)(*(long *)(*in_RSI + 0xf8) + 4)) /
                            (double)(in_RDI->master->field_19).master.inputSampleRate);
  *(uint *)(*in_RSI + 200) =
       (int)(long)dVar12 + (uint)*(ushort *)(*(long *)(*in_RSI + 0xf8) + 2) * 2;
  FAudio_INTERNAL_ResizeDecodeCache(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  LinkedList_PrependEntry
            ((LinkedList **)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,
             (FAudioMallocFunc)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  FAudio_AddRef(in_RDI);
  return 0;
}

Assistant:

uint32_t FAudio_CreateSourceVoice(
	FAudio *audio,
	FAudioSourceVoice **ppSourceVoice,
	const FAudioWaveFormatEx *pSourceFormat,
	uint32_t Flags,
	float MaxFrequencyRatio,
	FAudioVoiceCallback *pCallback,
	const FAudioVoiceSends *pSendList,
	const FAudioEffectChain *pEffectChain
) {
	uint32_t i;

	LOG_API_ENTER(audio)
	LOG_FORMAT(audio, pSourceFormat)

	*ppSourceVoice = (FAudioSourceVoice*) audio->pMalloc(sizeof(FAudioVoice));
	FAudio_zero(*ppSourceVoice, sizeof(FAudioSourceVoice));
	(*ppSourceVoice)->audio = audio;
	(*ppSourceVoice)->type = FAUDIO_VOICE_SOURCE;
	(*ppSourceVoice)->flags = Flags;
	(*ppSourceVoice)->filter.Type = FAUDIO_DEFAULT_FILTER_TYPE;
	(*ppSourceVoice)->filter.Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
	(*ppSourceVoice)->filter.OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
	(*ppSourceVoice)->sendLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->sendLock)
	(*ppSourceVoice)->effectLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->effectLock)
	(*ppSourceVoice)->filterLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->filterLock)
	(*ppSourceVoice)->volumeLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->volumeLock)

	/* Source Properties */
	FAudio_assert(MaxFrequencyRatio <= FAUDIO_MAX_FREQ_RATIO);
	(*ppSourceVoice)->src.maxFreqRatio = MaxFrequencyRatio;

	if (	pSourceFormat->wFormatTag == FAUDIO_FORMAT_PCM ||
		pSourceFormat->wFormatTag == FAUDIO_FORMAT_IEEE_FLOAT ||
		pSourceFormat->wFormatTag == FAUDIO_FORMAT_WMAUDIO2	)
	{
		FAudioWaveFormatExtensible *fmtex = (FAudioWaveFormatExtensible*) audio->pMalloc(
			sizeof(FAudioWaveFormatExtensible)
		);
		/* convert PCM to EXTENSIBLE */
		fmtex->Format.wFormatTag = FAUDIO_FORMAT_EXTENSIBLE;
		fmtex->Format.nChannels = pSourceFormat->nChannels;
		fmtex->Format.nSamplesPerSec = pSourceFormat->nSamplesPerSec;
		fmtex->Format.nAvgBytesPerSec = pSourceFormat->nAvgBytesPerSec;
		fmtex->Format.nBlockAlign = pSourceFormat->nBlockAlign;
		fmtex->Format.wBitsPerSample = pSourceFormat->wBitsPerSample;
		fmtex->Format.cbSize = sizeof(FAudioWaveFormatExtensible) - sizeof(FAudioWaveFormatEx);
		fmtex->Samples.wValidBitsPerSample = pSourceFormat->wBitsPerSample;
		fmtex->dwChannelMask = 0;
		if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_PCM)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_PCM, sizeof(FAudioGUID));
		}
		else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_IEEE_FLOAT)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_IEEE_FLOAT, sizeof(FAudioGUID));
		}
		else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_WMAUDIO2)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_WMAUDIO2, sizeof(FAudioGUID));
		}
		(*ppSourceVoice)->src.format = &fmtex->Format;
	}
	else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		FAudioADPCMWaveFormat *fmtex = (FAudioADPCMWaveFormat*) audio->pMalloc(
			sizeof(FAudioADPCMWaveFormat)
		);

		/* Copy what we can, ideally the sizes match! */
		size_t cbSize = sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize;
		FAudio_memcpy(
			fmtex,
			pSourceFormat,
			FAudio_min(cbSize, sizeof(FAudioADPCMWaveFormat))
		);
		if (cbSize < sizeof(FAudioADPCMWaveFormat))
		{
			FAudio_zero(
				((uint8_t*) fmtex) + cbSize,
				sizeof(FAudioADPCMWaveFormat) - cbSize
			);
		}

		/* XAudio2 does not validate this input! */
		fmtex->wfx.cbSize = sizeof(FAudioADPCMWaveFormat) - sizeof(FAudioWaveFormatEx);
		fmtex->wSamplesPerBlock = ((
			fmtex->wfx.nBlockAlign / fmtex->wfx.nChannels
		) - 6) * 2;
		(*ppSourceVoice)->src.format = &fmtex->wfx;
	}
	else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
		FAudioXMA2WaveFormat *fmtex = (FAudioXMA2WaveFormat*) audio->pMalloc(
			sizeof(FAudioXMA2WaveFormat)
		);

		/* Copy what we can, ideally the sizes match! */
		size_t cbSize = sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize;
		FAudio_memcpy(
			fmtex,
			pSourceFormat,
			FAudio_min(cbSize, sizeof(FAudioXMA2WaveFormat))
		);
		if (cbSize < sizeof(FAudioXMA2WaveFormat))
		{
			FAudio_zero(
				((uint8_t*) fmtex) + cbSize,
				sizeof(FAudioADPCMWaveFormat) - cbSize
			);
		}

		/* Does XAudio2 validate this input?! */
		fmtex->wfx.cbSize = sizeof(FAudioXMA2WaveFormat) - sizeof(FAudioWaveFormatEx);
		(*ppSourceVoice)->src.format = &fmtex->wfx;
	}
	else
	{
		/* direct copy anything else */
		(*ppSourceVoice)->src.format = (FAudioWaveFormatEx*) audio->pMalloc(
			sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize
		);
		FAudio_memcpy(
			(*ppSourceVoice)->src.format,
			pSourceFormat,
			sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize
		);
	}

	(*ppSourceVoice)->src.callback = pCallback;
	(*ppSourceVoice)->src.active = 0;
	(*ppSourceVoice)->src.freqRatio = 1.0f;
	(*ppSourceVoice)->src.totalSamples = 0;
	(*ppSourceVoice)->src.bufferList = NULL;
	(*ppSourceVoice)->src.flushList = NULL;
	(*ppSourceVoice)->src.bufferLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->src.bufferLock)

	if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_EXTENSIBLE)
	{
		FAudioWaveFormatExtensible *fmtex = (FAudioWaveFormatExtensible*) (*ppSourceVoice)->src.format;

		#define COMPARE_GUID(type) \
			(FAudio_memcmp( \
				&fmtex->SubFormat, \
				&DATAFORMAT_SUBTYPE_##type, \
				sizeof(FAudioGUID) \
			) == 0)
		if (COMPARE_GUID(PCM))
		{
			#define DECODER(bit) \
				if (fmtex->Format.wBitsPerSample == bit) \
				{ \
					(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM##bit; \
				}
			DECODER(16)
			else DECODER(8)
			else DECODER(24)
			else DECODER(32)
			else
			{
				LOG_ERROR(
					audio,
					"Unrecognized wBitsPerSample: %d",
					fmtex->Format.wBitsPerSample
				)
				FAudio_assert(0 && "Unrecognized wBitsPerSample!");
			}
			#undef DECODER
		}
		else if (COMPARE_GUID(IEEE_FLOAT))
		{
			/* FIXME: Weird behavior!
			 * Prototype creates a source with the IEEE_FLOAT tag,
			 * but it's actually PCM16. It seems to prioritize
			 * wBitsPerSample over the format tag. Not sure if we
			 * should fold this section into the section above...?
			 * -flibit
			 */
			if (fmtex->Format.wBitsPerSample == 16)
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM16;
			}
			else
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM32F;
			}
		}
		else if (	COMPARE_GUID(WMAUDIO2) ||
				COMPARE_GUID(WMAUDIO3) ||
				COMPARE_GUID(WMAUDIO_LOSSLESS)	)
		{
#ifdef HAVE_WMADEC
			if (FAudio_WMADEC_init(*ppSourceVoice, fmtex->SubFormat.Data1) != 0)
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
			}
#else
			FAudio_assert(0 && "xWMA is not supported!");
			(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
#endif /* HAVE_WMADEC */
		}
		else
		{
			FAudio_assert(0 && "Unsupported WAVEFORMATEXTENSIBLE subtype!");
		}
		#undef COMPARE_GUID
	}
	else if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
#ifdef HAVE_WMADEC
		if (FAudio_WMADEC_init(*ppSourceVoice, FAUDIO_FORMAT_XMAUDIO2) != 0)
		{
			(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
		}
#else
		FAudio_assert(0 && "XMA2 is not supported!");
		(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
#endif /* HAVE_WMADEC */
	}
	else if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		(*ppSourceVoice)->src.decode = ((*ppSourceVoice)->src.format->nChannels == 2) ?
			FAudio_INTERNAL_DecodeStereoMSADPCM :
			FAudio_INTERNAL_DecodeMonoMSADPCM;
	}
	else
	{
		FAudio_assert(0 && "Unsupported format tag!");
	}

	if ((*ppSourceVoice)->src.format->nChannels == 1)
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleMono;
	}
	else if ((*ppSourceVoice)->src.format->nChannels == 2)
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleStereo;
	}
	else
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleGeneric;
	}

	(*ppSourceVoice)->src.curBufferOffset = 0;

	/* Sends/Effects */
	FAudio_INTERNAL_VoiceOutputFrequency(*ppSourceVoice, pSendList);
	FAudioVoice_SetEffectChain(*ppSourceVoice, pEffectChain);

	/* Default Levels */
	(*ppSourceVoice)->volume = 1.0f;
	(*ppSourceVoice)->channelVolume = (float*) audio->pMalloc(
		sizeof(float) * (*ppSourceVoice)->outputChannels
	);
	for (i = 0; i < (*ppSourceVoice)->outputChannels; i += 1)
	{
		(*ppSourceVoice)->channelVolume[i] = 1.0f;
	}

	FAudioVoice_SetOutputVoices(*ppSourceVoice, pSendList);

	/* Filters */
	if (Flags & FAUDIO_VOICE_USEFILTER)
	{
		(*ppSourceVoice)->filterState = (FAudioFilterState*) audio->pMalloc(
			sizeof(FAudioFilterState) * (*ppSourceVoice)->src.format->nChannels
		);
		FAudio_zero(
			(*ppSourceVoice)->filterState,
			sizeof(FAudioFilterState) * (*ppSourceVoice)->src.format->nChannels
		);
	}

	/* Sample Storage */
	(*ppSourceVoice)->src.decodeSamples = (uint32_t) (FAudio_ceil(
		(double) audio->updateSize *
		(double) MaxFrequencyRatio *
		(double) (*ppSourceVoice)->src.format->nSamplesPerSec /
		(double) audio->master->master.inputSampleRate
	)) + EXTRA_DECODE_PADDING * (*ppSourceVoice)->src.format->nChannels;
	FAudio_INTERNAL_ResizeDecodeCache(
		audio,
		((*ppSourceVoice)->src.decodeSamples + EXTRA_DECODE_PADDING) * (*ppSourceVoice)->src.format->nChannels
	);

	LOG_INFO(audio, "-> %p", (void*) (*ppSourceVoice))

	/* Add to list, finally. */
	LinkedList_PrependEntry(
		&audio->sources,
		*ppSourceVoice,
		audio->sourceLock,
		audio->pMalloc
	);
	FAudio_AddRef(audio);

#ifdef FAUDIO_DUMP_VOICES
	FAudio_DUMPVOICE_Init(*ppSourceVoice);
#endif /* FAUDIO_DUMP_VOICES */

	LOG_API_EXIT(audio)
	return 0;
}